

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O2

void __thiscall chipemu::implementation::nmos::nmos(nmos *this,void **vtt,chip_description *desc)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  void *pvVar4;
  bool *pbVar5;
  pointer ptVar6;
  pointer ptVar7;
  pointer pptVar8;
  pointer pptVar9;
  ushort uVar10;
  uint16_t uVar11;
  nmos *this_00;
  bool bVar12;
  _Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  *p_Var13;
  pointer pcVar14;
  pointer pcVar15;
  pointer __result;
  pointer pcVar16;
  pointer __p;
  ulong uVar17;
  logic_error *this_01;
  out_of_range *this_02;
  _Tp_alloc_type *__alloc;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__s;
  long lVar18;
  long lVar19;
  pointer pcVar20;
  transdef *ptVar21;
  ulong uVar22;
  ulong uVar23;
  uint index;
  ulong uVar24;
  transdef *ptVar25;
  transdef *this_03;
  undefined1 auVar26 [32];
  unsigned_short local_f2;
  nmos *local_f0;
  pointer local_e8;
  pointer local_e0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> nodes;
  vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  cnodes;
  vector<unsigned_short,_std::allocator<unsigned_short>_> node_offsets;
  pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_60;
  
  pvVar4 = *vtt;
  *(void **)this = pvVar4;
  __alloc = (_Tp_alloc_type *)vtt[1];
  *(_Tp_alloc_type **)(&this->field_0x0 + *(long *)((long)pvVar4 + -0x48)) = __alloc;
  auVar26 = ZEXT1632(ZEXT816(0) << 0x40);
  this->changed_feeding = (iterator)auVar26._0_8_;
  this->current_group = (vector<unsigned_short,_std::allocator<unsigned_short>_>)auVar26._8_24_;
  (this->group_tail)._M_current = (unsigned_short *)0x0;
  this->changed_queue = (vector<unsigned_short,_std::allocator<unsigned_short>_>)auVar26._0_24_;
  this->changed_eating = (iterator)auVar26._24_8_;
  auVar26 = ZEXT1632(ZEXT816(0) << 0x40);
  this->nodes = (vector<unsigned_short,_std::allocator<unsigned_short>_>)auVar26._0_24_;
  (this->node_offsets).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar26._24_8_;
  *(undefined1 (*) [32])
   &(this->node_offsets).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
    .super__Vector_impl_data._M_finish = auVar26;
  (this->change_order).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = desc->node_ground;
  this->power = desc->node_power;
  this->ground = uVar11;
  cnodes.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT416(0) << 0x40;
  cnodes.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = this;
  p_Var13 = (_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
             *)std::
               vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
               ::_M_check_len(&cnodes,(size_type)vtt,(char *)desc);
  pcVar14 = std::
            _Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
            ::_M_allocate(p_Var13,(size_t)vtt);
  pcVar14->is_pullup = false;
  auVar26 = ZEXT1632(ZEXT816(0) << 0x40);
  pcVar14->gates =
       (vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
        )auVar26._0_24_;
  (pcVar14->sibling_connectors).
  super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar26._24_8_;
  *(undefined1 (*) [32])
   &(pcVar14->gates).
    super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar26;
  pcVar15 = std::
            vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
            ::_S_relocate((pointer)0x0,(pointer)0x0,pcVar14,__alloc);
  __p = (pointer)0x0;
  pcVar15 = std::
            vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
            ::_S_relocate((pointer)0x0,(pointer)0x0,pcVar15 + 1,__alloc);
  pcVar20 = pcVar14 + (long)p_Var13;
  __s = extraout_RDX;
  local_e8 = pcVar14;
  cnodes.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pcVar20;
  cnodes.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._M_start = pcVar14;
  for (uVar24 = 0;
      cnodes.
      super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar15, uVar24 < desc->node_count;
      uVar24 = uVar24 + 1) {
    pbVar5 = desc->pullups;
    if (pcVar15 == pcVar20) {
      p_Var13 = (_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                 *)std::
                   vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                   ::_M_check_len(&cnodes,(size_type)__p,__s);
      __result = std::
                 _Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                 ::_M_allocate(p_Var13,(size_t)__p);
      pcVar14 = local_e8;
      lVar19 = (long)pcVar20 - (long)local_e8;
      *(bool *)((long)__result + lVar19) = pbVar5[uVar24];
      *(undefined1 (*) [32])((long)__result + lVar19 + 8) = ZEXT1632(ZEXT816(0) << 0x40);
      *(undefined1 (*) [32])((long)__result + lVar19 + 0x18) = ZEXT1632(ZEXT816(0) << 0x40);
      local_e0 = (pointer)p_Var13;
      pcVar16 = std::
                vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                ::_S_relocate(local_e8,pcVar15,__result,__alloc);
      pcVar15 = std::
                vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                ::_S_relocate(pcVar15,pcVar15,pcVar16 + 1,__alloc);
      __alloc = (_Tp_alloc_type *)0x38;
      __p = (pointer)(lVar19 / 0x38);
      std::
      _Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
      ::_M_deallocate((_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                       *)pcVar14,__p,lVar19 % 0x38);
      pcVar20 = __result + (long)local_e0;
      __s = extraout_RDX_00;
      local_e8 = __result;
      cnodes.
      super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pcVar20;
      cnodes.
      super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
    }
    else {
      pcVar15->is_pullup = pbVar5[uVar24];
      auVar26 = ZEXT1632(ZEXT816(0) << 0x40);
      pcVar15->gates =
           (vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
            )auVar26._0_24_;
      (pcVar15->sibling_connectors).
      super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar26._24_8_;
      *(undefined1 (*) [32])
       &(pcVar15->gates).
        super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar26;
      pcVar15 = pcVar15 + 1;
    }
  }
  ptVar21 = desc->transistors;
  this_03 = ptVar21;
  do {
    local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = &ptVar21->gate;
    if (ptVar21 == this_03 + desc->transistor_count) {
      nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f2 = 0;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (&node_offsets,&local_f2);
      pcVar14 = cnodes.
                super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_e0 = cnodes.
                 super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_e8 = (pointer)(((long)cnodes.
                                  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)cnodes.
                                 super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x38);
      uVar24 = 1;
      while( true ) {
        this_00 = local_f0;
        uVar24 = uVar24 & 0xffff;
        if (local_e8 <= uVar24) {
          for (uVar24 = 1; uVar24 = uVar24 & 0xffff, uVar24 < local_e8;
              uVar24 = (ulong)((int)uVar24 + 1)) {
            uVar2 = node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar24];
            ptVar6 = local_e0[uVar24].gates.
                     super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ptVar7 = local_e0[uVar24].gates.
                     super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (uVar17 = 0; uVar22 = uVar17 & 0xffff,
                uVar22 < (ulong)(((long)ptVar7 - (long)ptVar6) / 6); uVar17 = uVar17 + 1) {
              nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start[(ulong)uVar2 + uVar17 * 2 + 3] =
                   ptVar6[uVar22].c1 * 2;
              nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start[(ulong)uVar2 + uVar17 * 2 + 4] =
                   ptVar6[uVar22].c2 * 2;
            }
          }
          uVar24 = 1;
          do {
            uVar17 = uVar24 & 0xffff;
            if (local_e8 <= uVar17) {
              std::
              pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
              ::
              pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_&,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_&,_true>
                        (&local_60,&node_offsets,&nodes);
              std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                        (&node_offsets.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
              std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                        (&nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
              ;
              nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)&this->nodes;
              nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&this->node_offsets;
              std::
              tuple<std::vector<unsigned_short,std::allocator<unsigned_short>>&,std::vector<unsigned_short,std::allocator<unsigned_short>>&>
              ::operator=((tuple<std::vector<unsigned_short,std::allocator<unsigned_short>>&,std::vector<unsigned_short,std::allocator<unsigned_short>>&>
                           *)&nodes,&local_60);
              std::
              pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
              ::~pair(&local_60);
              this_00->desc_nodes_count = (uint16_t)desc->node_count;
              this_00->desc_transistor_count = (uint16_t)desc->transistor_count;
              changed_queue_init(this_00);
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                        (&this->change_order,(ulong)this_00->desc_nodes_count);
              group_init(this_00);
              puVar1 = (this_00->nodes).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start +
                       (this_00->node_offsets).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start[this_00->power];
              *puVar1 = *puVar1 | 4;
              std::
              vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
              ::~vector(&cnodes);
              return;
            }
            uVar2 = node_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar17];
            uVar3 = nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start[(ulong)uVar2 + 1];
            pptVar8 = local_e0[uVar17].sibling_connectors.
                      super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pptVar9 = local_e0[uVar17].sibling_connectors.
                      super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (uVar22 = 0; uVar22 = uVar22 & 0xffff,
                uVar22 < (ulong)((long)pptVar9 - (long)pptVar8 >> 3);
                uVar22 = (ulong)((int)uVar22 + 1)) {
              ptVar21 = pptVar8[uVar22];
              uVar23 = (ulong)((uint)node_offsets.
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_start[ptVar21->gate] * 2);
              lVar18 = -6 - uVar23;
              lVar19 = 0;
              while( true ) {
                if (*(short *)((long)nodes.
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar23 + 2) ==
                    (short)lVar19) {
                  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(this_01,"building nodes");
                  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                }
                uVar10 = *(ushort *)
                          ((long)nodes.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar19 * 4 + uVar23 + 6
                          ) >> 1;
                if ((uVar10 == ptVar21->c1) &&
                   (*(ushort *)
                     ((long)nodes.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar19 * 4 + uVar23 + 8) >> 1
                    == ptVar21->c2)) break;
                lVar19 = lVar19 + 1;
                lVar18 = lVar18 + -4;
              }
              nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start[(ulong)uVar2 + (ulong)uVar3 * 2 + uVar22 + 3] =
                   (unsigned_short)((uint)(uVar10 == (ushort)uVar24) * 2 - (int)lVar18 >> 1);
            }
            uVar24 = (ulong)((int)uVar17 + 1);
          } while( true );
        }
        uVar17 = (long)nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)nodes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 1;
        if (0xfffe < uVar17) break;
        local_f2 = (unsigned_short)uVar17;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&node_offsets,&local_f2);
        local_f2 = (unsigned_short)pcVar14[uVar24].is_pullup;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&nodes,&local_f2);
        local_f2 = (unsigned_short)
                   (((long)pcVar14[uVar24].gates.
                           super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pcVar14[uVar24].gates.
                          super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 6);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&nodes,&local_f2);
        local_f2 = (unsigned_short)
                   ((uint)(*(int *)&pcVar14[uVar24].sibling_connectors.
                                    super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&pcVar14[uVar24].sibling_connectors.
                                   super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  (&nodes,&local_f2);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  (&nodes,((long)nodes.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)nodes.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 1) +
                          (((long)pcVar14[uVar24].gates.
                                  super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)pcVar14[uVar24].gates.
                                 super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 6) * 2);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  (&nodes,((long)pcVar14[uVar24].sibling_connectors.
                                 super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)pcVar14[uVar24].sibling_connectors.
                                 super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) +
                          ((long)nodes.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)nodes.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 1));
        uVar24 = (ulong)((int)uVar24 + 1);
      }
      __assert_fail("std::numeric_limits<uint16_t>::max() > nodes.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GBuella[P]chipemu/src/nmos.cc"
                    ,0x144,
                    "pair<vector<uint16_t>, vector<uint16_t>> chipemu::implementation::create_nodes(const vector<construct_node> &)"
                   );
    }
    uVar24 = ((long)cnodes.
                    super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)cnodes.
                   super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x38;
    if (((uVar24 <= ptVar21->gate) || (uVar24 <= ptVar21->c1)) || (uVar24 <= ptVar21->c2)) {
      this_02 = (out_of_range *)
                __cxa_allocate_exception
                          (0x10,0x38,
                           ((long)cnodes.
                                  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)cnodes.
                                 super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                                 ._M_impl.super__Vector_impl_data._M_start) % 0x38);
      std::out_of_range::out_of_range(this_02,"node id");
      __cxa_throw(this_02,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    lVar19 = (long)ptVar21 - (long)this_03;
    for (lVar18 = lVar19 / 6 >> 2; ptVar25 = this_03, 0 < lVar18; lVar18 = lVar18 + -1) {
      bVar12 = transdef::operator==(this_03,ptVar21);
      if (bVar12) goto LAB_00113c11;
      bVar12 = transdef::operator==(this_03 + 1,ptVar21);
      ptVar25 = this_03 + 1;
      if (bVar12) goto LAB_00113c11;
      bVar12 = transdef::operator==(this_03 + 2,ptVar21);
      ptVar25 = this_03 + 2;
      if (bVar12) goto LAB_00113c11;
      bVar12 = transdef::operator==(this_03 + 3,ptVar21);
      ptVar25 = this_03 + 3;
      if (bVar12) goto LAB_00113c11;
      this_03 = this_03 + 4;
      lVar19 = lVar19 + -0x18;
    }
    lVar19 = lVar19 / 6;
    if (lVar19 == 1) {
LAB_00113ca5:
      bVar12 = transdef::operator==(this_03,ptVar21);
      ptVar25 = this_03;
      if (bVar12) goto LAB_00113c11;
LAB_00113c16:
      pcVar14 = cnodes.
                super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
      ::push_back(&cnodes.
                   super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*local_60.first.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start].gates,
                  (value_type *)
                  local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
      ::push_back(&pcVar14[*(uint16_t *)
                            ((long)local_60.first.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 2)].
                   sibling_connectors,(value_type *)&local_60);
      std::
      vector<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
      ::push_back(&pcVar14[*(uint16_t *)
                            ((long)local_60.first.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 4)].
                   sibling_connectors,(value_type *)&local_60);
    }
    else {
      if (lVar19 == 2) {
LAB_00113bf8:
        bVar12 = transdef::operator==(ptVar25,ptVar21);
        if (!bVar12) {
          this_03 = ptVar25 + 1;
          goto LAB_00113ca5;
        }
      }
      else {
        if (lVar19 != 3) goto LAB_00113c16;
        bVar12 = transdef::operator==(this_03,ptVar21);
        if (!bVar12) {
          ptVar25 = this_03 + 1;
          goto LAB_00113bf8;
        }
      }
LAB_00113c11:
      if (ptVar25 == ptVar21) goto LAB_00113c16;
    }
    ptVar21 = (transdef *)
              ((long)local_60.first.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start + 6);
    this_03 = desc->transistors;
  } while( true );
}

Assistant:

nmos::nmos(const chip_description& desc):
    power(desc.node_power),
    ground(desc.node_ground)
{
    auto cnodes = create_construct_nodes(desc);
    setup_transistors(desc, cnodes);
    tie(node_offsets, nodes) = create_nodes(cnodes);
    desc_nodes_count = desc.node_count;
    desc_transistor_count = desc.transistor_count;
    changed_queue_init();
    change_order.resize(node_count());
    group_init();
    node_addr(power)[0] |= node_is_high;
}